

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::formatToName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,deUint32 format)

{
  bool bVar1;
  deUint32 internalFormat;
  string enumName;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  code *local_30;
  deUint32 local_28;
  
  internalFormat = (deUint32)this;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar1 = glu::isCompressedFormat(internalFormat);
  local_28 = internalFormat;
  if (bVar1) {
    local_30 = glu::getCompressedTextureFormatName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_30);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_90);
  }
  else {
    local_30 = glu::getUncompressedTextureFormatName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_30);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_90);
  }
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  de::toLower(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string formatToName (deUint32 format)
{
	string enumName;

	if (glu::isCompressedFormat(format))
		enumName = glu::getCompressedTextureFormatStr(format).toString().substr(14); // Strip GL_COMPRESSED_
	else
		enumName = glu::getUncompressedTextureFormatStr(format).toString().substr(3); // Strip GL_

	return de::toLower(enumName);
}